

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsInstPrinter.c
# Opt level: O0

char * printAlias(MCInst *MI,SStream *OS)

{
  _Bool _Var1;
  uint uVar2;
  char *pcVar3;
  SStream *OS_local;
  MCInst *MI_local;
  
  uVar2 = MCInst_getOpcode(MI);
  if (uVar2 == 0xa6) {
    _Var1 = isReg(MI,0,0x9b);
    if (_Var1) {
      MI_local = (MCInst *)printAlias1("bc1f",MI,1,OS);
    }
    else {
      MI_local = (MCInst *)0x0;
    }
  }
  else if (uVar2 == 0xaa) {
    _Var1 = isReg(MI,0,0x9b);
    if (_Var1) {
      MI_local = (MCInst *)printAlias1("bc1t",MI,1,OS);
    }
    else {
      MI_local = (MCInst *)0x0;
    }
  }
  else if (uVar2 == 0xbf) {
    _Var1 = isReg(MI,0,0x15);
    if ((_Var1) && (_Var1 = isReg(MI,1,0x15), _Var1)) {
      MI_local = (MCInst *)printAlias1("b",MI,2,OS);
    }
    else {
      _Var1 = isReg(MI,1,0x15);
      if (_Var1) {
        MI_local = (MCInst *)printAlias2("beqz",MI,0,2,OS);
      }
      else {
        MI_local = (MCInst *)0x0;
      }
    }
  }
  else if (uVar2 == 0xc0) {
    _Var1 = isReg(MI,1,0x14b);
    if (_Var1) {
      MI_local = (MCInst *)printAlias2("beqz",MI,0,2,OS);
    }
    else {
      MI_local = (MCInst *)0x0;
    }
  }
  else if (uVar2 == 0xc2) {
    _Var1 = isReg(MI,0,0x15);
    if ((_Var1) && (_Var1 = isReg(MI,1,0x15), _Var1)) {
      MI_local = (MCInst *)printAlias2("beqzl",MI,0,2,OS);
    }
    else {
      MI_local = (MCInst *)0x0;
    }
  }
  else if (uVar2 == 0xcb) {
    _Var1 = isReg(MI,0,0x15);
    if (_Var1) {
      MI_local = (MCInst *)printAlias1("bal",MI,1,OS);
    }
    else {
      MI_local = (MCInst *)0x0;
    }
  }
  else if (uVar2 == 0x101) {
    _Var1 = isReg(MI,1,0x15);
    if (_Var1) {
      MI_local = (MCInst *)printAlias2("bnez",MI,0,2,OS);
    }
    else {
      MI_local = (MCInst *)0x0;
    }
  }
  else if (uVar2 == 0x102) {
    _Var1 = isReg(MI,1,0x14b);
    if (_Var1) {
      MI_local = (MCInst *)printAlias2("bnez",MI,0,2,OS);
    }
    else {
      MI_local = (MCInst *)0x0;
    }
  }
  else if (uVar2 == 0x10c) {
    _Var1 = isReg(MI,1,0x15);
    if (_Var1) {
      MI_local = (MCInst *)printAlias2("bnezl",MI,0,2,OS);
    }
    else {
      MI_local = (MCInst *)0x0;
    }
  }
  else if (uVar2 == 0x364) {
    _Var1 = isReg(MI,0,0x13);
    if (_Var1) {
      MI_local = (MCInst *)printAlias1("jalr",MI,1,OS);
    }
    else {
      MI_local = (MCInst *)0x0;
    }
  }
  else if (uVar2 == 0x366) {
    _Var1 = isReg(MI,0,0x115);
    if (_Var1) {
      MI_local = (MCInst *)printAlias1("jalr",MI,1,OS);
    }
    else {
      MI_local = (MCInst *)0x0;
    }
  }
  else {
    if (uVar2 != 0x4d3) {
      if (uVar2 == 0x4d4) {
        _Var1 = isReg(MI,2,0x14b);
        if (!_Var1) {
          return (char *)0x0;
        }
        pcVar3 = printAlias2("not",MI,0,1,OS);
        return pcVar3;
      }
      if (uVar2 != 0x4d6) {
        if (uVar2 != 0x4dd) {
          return (char *)0x0;
        }
        _Var1 = isReg(MI,2,0x15);
        if (!_Var1) {
          return (char *)0x0;
        }
        pcVar3 = printAlias2("move",MI,0,1,OS);
        return pcVar3;
      }
    }
    _Var1 = isReg(MI,2,0x15);
    if (_Var1) {
      MI_local = (MCInst *)printAlias2("not",MI,0,1,OS);
    }
    else {
      MI_local = (MCInst *)0x0;
    }
  }
  return (char *)MI_local;
}

Assistant:

static char *printAlias(MCInst *MI, SStream *OS)
{
	switch (MCInst_getOpcode(MI)) {
		case Mips_BEQ:
			// beq $zero, $zero, $L2 => b $L2
			// beq $r0, $zero, $L2 => beqz $r0, $L2
			if (isReg(MI, 0, Mips_ZERO) && isReg(MI, 1, Mips_ZERO))
				return printAlias1("b", MI, 2, OS);
			if (isReg(MI, 1, Mips_ZERO))
				return printAlias2("beqz", MI, 0, 2, OS);
			return NULL;
		case Mips_BEQL:
			// beql $r0, $zero, $L2 => beqzl $r0, $L2
			if (isReg(MI, 0, Mips_ZERO) && isReg(MI, 1, Mips_ZERO))
				return printAlias2("beqzl", MI, 0, 2, OS);
			return NULL;
		case Mips_BEQ64:
			// beq $r0, $zero, $L2 => beqz $r0, $L2
			if (isReg(MI, 1, Mips_ZERO_64))
				return printAlias2("beqz", MI, 0, 2, OS);
			return NULL;
		case Mips_BNE:
			// bne $r0, $zero, $L2 => bnez $r0, $L2
			if (isReg(MI, 1, Mips_ZERO))
				return printAlias2("bnez", MI, 0, 2, OS);
			return NULL;
		case Mips_BNEL:
			// bnel $r0, $zero, $L2 => bnezl $r0, $L2
			if (isReg(MI, 1, Mips_ZERO))
				return printAlias2("bnezl", MI, 0, 2, OS);
			return NULL;
		case Mips_BNE64:
			// bne $r0, $zero, $L2 => bnez $r0, $L2
			if (isReg(MI, 1, Mips_ZERO_64))
				return printAlias2("bnez", MI, 0, 2, OS);
			return NULL;
		case Mips_BGEZAL:
			// bgezal $zero, $L1 => bal $L1
			if (isReg(MI, 0, Mips_ZERO))
				return printAlias1("bal", MI, 1, OS);
			return NULL;
		case Mips_BC1T:
			// bc1t $fcc0, $L1 => bc1t $L1
			if (isReg(MI, 0, Mips_FCC0))
				return printAlias1("bc1t", MI, 1, OS);
			return NULL;
		case Mips_BC1F:
			// bc1f $fcc0, $L1 => bc1f $L1
			if (isReg(MI, 0, Mips_FCC0))
				return printAlias1("bc1f", MI, 1, OS);
			return NULL;
		case Mips_JALR:
			// jalr $ra, $r1 => jalr $r1
			if (isReg(MI, 0, Mips_RA))
				return printAlias1("jalr", MI, 1, OS);
			return NULL;
		case Mips_JALR64:
			// jalr $ra, $r1 => jalr $r1
			if (isReg(MI, 0, Mips_RA_64))
				return printAlias1("jalr", MI, 1, OS);
			return NULL;
		case Mips_NOR:
		case Mips_NOR_MM:
			// nor $r0, $r1, $zero => not $r0, $r1
			if (isReg(MI, 2, Mips_ZERO))
				return printAlias2("not", MI, 0, 1, OS);
			return NULL;
		case Mips_NOR64:
			// nor $r0, $r1, $zero => not $r0, $r1
			if (isReg(MI, 2, Mips_ZERO_64))
				return printAlias2("not", MI, 0, 1, OS);
			return NULL;
		case Mips_OR:
			// or $r0, $r1, $zero => move $r0, $r1
			if (isReg(MI, 2, Mips_ZERO))
				return printAlias2("move", MI, 0, 1, OS);
			return NULL;
		default: return NULL;
	}
}